

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::DisableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  string_view fmt;
  key_type local_260;
  ErrorCode local_23c;
  Error local_238;
  ByteArray local_210;
  JoinerInfo *local_1f8;
  JoinerInfo *joiner;
  pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo> *kv;
  iterator __end2;
  iterator __begin2;
  map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
  *__range2;
  iterator local_1c8;
  undefined8 local_1c0;
  anon_class_1_0_00000001 local_1b2;
  v10 local_1b1;
  v10 *local_1b0;
  size_t local_1a8;
  string local_1a0;
  Error local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_158;
  ByteArray *steeringData;
  undefined1 local_140 [8];
  CommissionerDataset commDataset;
  ByteArray joinerId;
  uint64_t aEui64_local;
  JoinerType aType_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  Error::Error(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&commDataset.mJoinerUdpPort);
  CommissionerDataset::CommissionerDataset((CommissionerDataset *)local_140,&this->mCommDataset);
  commDataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       commDataset.mNmkpSteeringData.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 0x3f;
  local_158 = GetSteeringData((CommissionerDataset *)local_140,aType);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    DisableJoiner::anon_class_1_0_00000001::operator()(&local_1b2);
    local_58 = &local_1b0;
    local_60 = &local_1b1;
    bVar4 = ::fmt::v10::operator()(local_60);
    local_1a8 = bVar4.size_;
    local_1b0 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_1a0;
    local_78 = local_1b0;
    sStack_70 = local_1a8;
    local_50 = &local_78;
    local_88 = local_1b0;
    local_80 = local_1a8;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_1a0,local_88,fmt,args);
    Error::Error(&local_180,kInvalidState,&local_1a0);
    Error::operator=(__return_storage_ptr__,&local_180);
    Error::~Error(&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  else {
    __range2._7_1_ = 0;
    local_1c8 = (iterator)((long)&__range2 + 7);
    local_1c0 = 1;
    __l._M_len = 1;
    __l._M_array = local_1c8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_158,__l);
    __end2 = std::
             map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
             ::begin(&this->mJoiners);
    kv = (pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo> *)
         std::
         map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
         ::end(&this->mJoiners);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&kv), bVar1) {
      joiner = (JoinerInfo *)
               std::
               _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
               ::operator*(&__end2);
      local_1f8 = &((reference)joiner)->second;
      if ((local_1f8->mType != aType) || ((((reference)joiner)->second).mEui64 != aEui64)) {
        Commissioner::ComputeJoinerId(&local_210,aEui64);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &commDataset.mJoinerUdpPort,&local_210);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_210);
        Commissioner::AddJoiner(local_158,(ByteArray *)&commDataset.mJoinerUdpPort);
      }
      std::
      _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
      ::operator++(&__end2);
    }
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar3->_vptr_Commissioner[0x14])(&local_238,peVar3,local_140);
    aError = Error::operator=(__return_storage_ptr__,&local_238);
    local_23c = kNone;
    bVar1 = commissioner::operator!=(aError,&local_23c);
    Error::~Error(&local_238);
    if (!bVar1) {
      MergeDataset(&this->mCommDataset,(CommissionerDataset *)local_140);
      local_260.mType = aType;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_260.mId,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &commDataset.mJoinerUdpPort);
      std::
      map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
      ::erase(&this->mJoiners,&local_260);
      JoinerKey::~JoinerKey(&local_260);
    }
  }
  CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_140);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&commDataset.mJoinerUdpPort);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::DisableJoiner(JoinerType aType, uint64_t aEui64)
{
    Error     error;
    ByteArray joinerId;
    auto      commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    steeringData = {0x00};
    for (const auto &kv : mJoiners)
    {
        auto &joiner = kv.second;
        if (joiner.mType == aType && joiner.mEui64 == aEui64)
        {
            continue;
        }
        joinerId = Commissioner::ComputeJoinerId(aEui64);
        Commissioner::AddJoiner(steeringData, joinerId);
    }

    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    mJoiners.erase(JoinerKey{aType, joinerId});

exit:
    return error;
}